

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRBMemoryAllocator.cpp
# Opt level: O3

void __thiscall
Diligent::SRBMemoryAllocator::Initialize
          (SRBMemoryAllocator *this,Uint32 SRBAllocationGranularity,
          Uint32 ShaderVariableDataAllocatorCount,size_t *ShaderVariableDataSizes,
          Uint32 ResourceCacheDataAllocatorCount,size_t *ResourceCacheDataSizes)

{
  FixedBlockMemoryAllocator *pFVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t *psVar3;
  IMemoryAllocator *RawMemoryAllocator;
  ulong uVar4;
  string msg;
  string local_68;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  if (SRBAllocationGranularity < 2) {
    FormatString<char[26],char[29]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"SRBAllocationGranularity > 1",(char (*) [29])ShaderVariableDataSizes)
    ;
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x34);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->m_DataAllocators != (FixedBlockMemoryAllocator *)0x0) ||
      (this->m_ShaderVariableDataAllocatorCount != 0)) ||
     (this->m_ResourceCacheDataAllocatorCount != 0)) {
    FormatString<char[33]>(&local_68,(char (*) [33])"Allocator is already initialized");
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"Initialize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
               ,0x35);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
  this->m_ResourceCacheDataAllocatorCount = ResourceCacheDataAllocatorCount;
  if (ResourceCacheDataAllocatorCount + ShaderVariableDataAllocatorCount != 0) {
    local_40 = (ulong)(ResourceCacheDataAllocatorCount + ShaderVariableDataAllocatorCount);
    iVar2 = (**this->m_RawMemAllocator->_vptr_IMemoryAllocator)
                      (this->m_RawMemAllocator,local_40 * 0x130,
                       "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/SRBMemoryAllocator.cpp"
                       ,0x41);
    this->m_DataAllocators = (FixedBlockMemoryAllocator *)CONCAT44(extraout_var,iVar2);
    local_48 = (ulong)ShaderVariableDataAllocatorCount;
    uVar4 = 0;
    do {
      psVar3 = ResourceCacheDataSizes + ((int)uVar4 - ShaderVariableDataAllocatorCount);
      if (uVar4 < local_48) {
        psVar3 = ShaderVariableDataSizes + uVar4;
      }
      local_38 = *psVar3;
      pFVar1 = this->m_DataAllocators;
      RawMemoryAllocator = GetRawAllocator();
      FixedBlockMemoryAllocator::FixedBlockMemoryAllocator
                (pFVar1 + uVar4,RawMemoryAllocator,local_38,SRBAllocationGranularity);
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_40);
  }
  return;
}

Assistant:

void SRBMemoryAllocator::Initialize(Uint32              SRBAllocationGranularity,
                                    Uint32              ShaderVariableDataAllocatorCount,
                                    const size_t* const ShaderVariableDataSizes,
                                    Uint32              ResourceCacheDataAllocatorCount,
                                    const size_t* const ResourceCacheDataSizes)
{
    VERIFY_EXPR(SRBAllocationGranularity > 1);
    VERIFY(m_DataAllocators == nullptr && m_ShaderVariableDataAllocatorCount == 0 && m_ResourceCacheDataAllocatorCount == 0, "Allocator is already initialized");

    m_ShaderVariableDataAllocatorCount = ShaderVariableDataAllocatorCount;
    m_ResourceCacheDataAllocatorCount  = ResourceCacheDataAllocatorCount;
    auto TotalAllocatorCount           = m_ShaderVariableDataAllocatorCount + m_ResourceCacheDataAllocatorCount;

    if (TotalAllocatorCount == 0)
        return;

    auto* pAllocatorsRawMem = m_RawMemAllocator.Allocate(
        sizeof(FixedBlockMemoryAllocator) * TotalAllocatorCount,
        "Raw memory for SRBMemoryAllocator::m_ShaderVariableDataAllocators",
        __FILE__, __LINE__);
    m_DataAllocators = reinterpret_cast<FixedBlockMemoryAllocator*>(pAllocatorsRawMem);

    for (Uint32 s = 0; s < TotalAllocatorCount; ++s)
    {
        auto size = s < ShaderVariableDataAllocatorCount ? ShaderVariableDataSizes[s] : ResourceCacheDataSizes[s - ShaderVariableDataAllocatorCount];
        new (m_DataAllocators + s) FixedBlockMemoryAllocator(GetRawAllocator(), size, SRBAllocationGranularity);
    }
}